

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage8.cpp
# Opt level: O1

void test(bool verbose)

{
  int iVar1;
  ostream *poVar2;
  pstring astring;
  Framer framer;
  test_resource tpmr;
  char local_151;
  test_resource *local_150;
  long local_148;
  undefined8 *local_140;
  long *local_138;
  long local_130;
  long local_128 [2];
  Framer local_118;
  test_resource local_110;
  
  Framer::Framer(&local_118,"Stage8",verbose);
  std::pmr::test_resource::test_resource(&local_110,"stage8",verbose);
  local_110.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  local_148 = 7;
  local_150 = &local_110;
  local_140 = (undefined8 *)(**(code **)(local_110._0_8_ + 0x10))(&local_110,8,1);
  *local_140 = 0x6c6f6f66726162;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,local_140,local_148 + (long)local_140);
  iVar1 = std::__cxx11::string::compare((char *)&local_138);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"astring.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_138 = (long *)CONCAT71(local_138._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_138,1);
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,local_140,local_148 + (long)local_140);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_138,local_130);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"barfool",7);
    local_151 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_151,1);
    if (local_138 != local_128) {
      operator_delete(local_138,local_128[0] + 1);
    }
  }
  (**(code **)(*(long *)local_150 + 0x18))(local_150,local_140,local_148 + 1,1);
  std::pmr::test_resource::~test_resource(&local_110);
  Framer::~Framer(&local_118);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Stage8", verbose };

    std::pmr::test_resource tpmr{ "stage8", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };

    astring = astring;

    ASSERT_EQ(astring.str(), "barfool");
}